

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

int kftp_pasv_connect(knetFile *ftp)

{
  int iVar1;
  char local_72 [8];
  char port [10];
  char host [80];
  knetFile *ftp_local;
  
  if (ftp->pasv_port == 0) {
    fprintf(_stderr,"[kftp_pasv_connect] kftp_pasv_prep() is not called before hand.\n");
    ftp_local._4_4_ = -1;
  }
  else {
    sprintf(port + 2,"%d.%d.%d.%d",(ulong)(uint)ftp->pasv_ip[0],(ulong)(uint)ftp->pasv_ip[1],
            (ulong)(uint)ftp->pasv_ip[2],(ulong)(uint)ftp->pasv_ip[3]);
    sprintf(local_72,"%d",(ulong)(uint)ftp->pasv_port);
    iVar1 = socket_connect(port + 2,local_72);
    ftp->fd = iVar1;
    if (ftp->fd == -1) {
      ftp_local._4_4_ = -1;
    }
    else {
      ftp_local._4_4_ = 0;
    }
  }
  return ftp_local._4_4_;
}

Assistant:

static int kftp_pasv_connect(knetFile *ftp)
{
	char host[80], port[10];
	if (ftp->pasv_port == 0) {
		fprintf(stderr, "[kftp_pasv_connect] kftp_pasv_prep() is not called before hand.\n");
		return -1;
	}
	sprintf(host, "%d.%d.%d.%d", ftp->pasv_ip[0], ftp->pasv_ip[1], ftp->pasv_ip[2], ftp->pasv_ip[3]);
	sprintf(port, "%d", ftp->pasv_port);
	ftp->fd = socket_connect(host, port);
	if (ftp->fd == -1) return -1;
	return 0;
}